

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.cpp
# Opt level: O2

int GetHeadDataAndAuxDataSeanetEx
              (SEANET *pSeanet,uchar *scanline,double *pAngle,uchar *strippedauxdatabuf,
              int *pNbstrippedauxdatabytes)

{
  int *piVar1;
  uchar *puVar2;
  int iVar3;
  char *pcVar4;
  timeval *ptVar5;
  double *pdVar6;
  uint uVar7;
  size_t __nmemb;
  long lVar8;
  double dVar9;
  undefined4 uStack_40b0;
  int iStack_40ac;
  int aiStack_40a8 [4];
  uchar *puStack_4098;
  int *piStack_4090;
  double *pdStack_4088;
  int *piStack_4080;
  int *piStack_4078;
  int *piStack_4070;
  int *piStack_4068;
  int *piStack_4060;
  int *piStack_4058;
  undefined8 uStack_4050;
  char acStack_4048 [8192];
  undefined1 uStack_2048;
  char acStack_2038 [8200];
  
  if (bSeanetFromFile == 0) {
    iVar3 = GetHeadDataAndAuxDataSeanet
                      (pSeanet,scanline,pAngle,strippedauxdatabuf,pNbstrippedauxdatabytes);
    return iVar3;
  }
  if (bSeanetFromFile == 0) {
    iVar3 = GetHeadDataSeanet(pSeanet,scanline,pAngle);
    return iVar3;
  }
  aiStack_40a8[3] = 0;
  aiStack_40a8[2] = 0;
  aiStack_40a8[1] = 0;
  iStack_40ac = 0;
  uStack_4050 = 0;
  uStack_40b0 = 0;
  mSleep((long)pSeanet->threadperiod);
  pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
  if (seanetfilenextlinecmd < 1) {
    if (seanetfilenextlinecmd == 0) {
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      return 0;
    }
  }
  else {
    seanetfilenextlinecmd = seanetfilenextlinecmd + -1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
  pcVar4 = fgets3(seanetfile,acStack_2038,0x2001);
  if (pcVar4 == (char *)0x0) {
    puts("Error reading Seanet CSV file.");
    return 1;
  }
  aiStack_40a8[0] = 0;
  pcVar4 = acStack_4048;
  Hdctrl.u = 0;
  uStack_2048 = 0;
  piStack_4058 = &pSeanet->HeadStatus;
  piStack_4060 = &pSeanet->HeadRangescale;
  piStack_4068 = &pSeanet->HeadIGain;
  piStack_4070 = &pSeanet->HeadSlope;
  piStack_4078 = &pSeanet->HeadADLow;
  piStack_4080 = &pSeanet->HeadADSpan;
  piVar1 = &pSeanet->HeadSteps;
  piStack_4090 = &pSeanet->Dbytes;
  puStack_4098 = scanline;
  pdStack_4088 = pAngle;
  iVar3 = __isoc99_sscanf(acStack_2038,
                          "%03s,%d:%d:%lf,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%8192s",
                          aiStack_40a8,aiStack_40a8 + 3,aiStack_40a8 + 2,&uStack_4050,
                          aiStack_40a8 + 1,piStack_4058,&pSeanet->HeadHdCtrl,piStack_4060,
                          piStack_4068,piStack_4070,piStack_4078,piStack_4080,&pSeanet->HeadLeftLim,
                          &pSeanet->HeadRightLim,piVar1,&iStack_40ac,piStack_4090,pcVar4);
  if (iVar3 != 0x12) {
    puts("Skipping an invalid line in the CSV file.");
    return 0;
  }
  pSeanet->bDST = (uint)(aiStack_40a8[0] == 0x474944);
  uVar7 = (pSeanet->HeadHdCtrl).u & 1;
  pSeanet->adc8on = uVar7;
  pSeanet->HeadNBins = pSeanet->Dbytes << ((byte)uVar7 ^ 1);
  dVar9 = (double)pSeanet->HeadSteps * 0.05625;
  pSeanet->NSteps = (int)(360.0 / dVar9);
  pSeanet->StepAngleSize = dVar9;
  pSeanet->RangeScale = pSeanet->HeadRangescale / 10;
  pthread_mutex_lock((pthread_mutex_t *)&SeanetConnectingCS);
  if (AdLow == pSeanet->HeadADLow) {
    iVar3 = *piVar1;
    if (((((AdSpan == pSeanet->HeadADSpan) && (Steps == iVar3)) &&
         (Hdctrl.u == (pSeanet->HeadHdCtrl).u)) &&
        ((NBins == pSeanet->HeadNBins && (NSteps == pSeanet->NSteps)))) &&
       ((StepAngleSize == pSeanet->StepAngleSize &&
        ((!NAN(StepAngleSize) && !NAN(pSeanet->StepAngleSize) && (rangescale == pSeanet->RangeScale)
         ))))) goto LAB_00170f81;
  }
  else {
    iVar3 = *piVar1;
  }
  Hdctrl = pSeanet->HeadHdCtrl;
  NBins = pSeanet->HeadNBins;
  NSteps = pSeanet->NSteps;
  StepAngleSize = pSeanet->StepAngleSize;
  rangescale = pSeanet->RangeScale;
  index_scanlines_prev = 0;
  index_scanlines = 0;
  AdLow = pSeanet->HeadADLow;
  AdSpan = pSeanet->HeadADSpan;
  Steps = iVar3;
  free(tvs);
  free(angles);
  free(scanlines);
  __nmemb = (size_t)NSteps;
  ptVar5 = (timeval *)calloc(__nmemb,0x10);
  tvs = ptVar5;
  pdVar6 = (double *)calloc(__nmemb,8);
  angles = pdVar6;
  scanlines = (uchar *)calloc(__nmemb << 0xb,1);
  if ((pdVar6 == (double *)0x0 || ptVar5 == (timeval *)0x0) || scanlines == (uchar *)0x0) {
    puts("Unable to allocate Seanet data.");
    pthread_mutex_unlock((pthread_mutex_t *)&SeanetConnectingCS);
    return 1;
  }
LAB_00170f81:
  pthread_mutex_unlock((pthread_mutex_t *)&SeanetConnectingCS);
  puVar2 = puStack_4098;
  *pdStack_4088 = (double)((iStack_40ac + 0xc80) % 0x1900) * 0.05625;
  if ((Hdctrl.u & 1) == 0) {
    pcVar4 = acStack_4048;
    for (lVar8 = 0; lVar8 < *piStack_4090; lVar8 = lVar8 + 1) {
      __isoc99_sscanf(pcVar4,"%d",&uStack_40b0);
      puVar2[lVar8 * 2] = (byte)uStack_40b0 & 0xf0;
      puVar2[lVar8 * 2 + 1] = (byte)uStack_40b0 << 4;
      pcVar4 = strchr(pcVar4,0x2c);
      if (pcVar4 == (char *)0x0) {
        return 0;
      }
      pcVar4 = pcVar4 + 1;
    }
  }
  else {
    for (lVar8 = 0; lVar8 < *piStack_4090; lVar8 = lVar8 + 1) {
      __isoc99_sscanf(pcVar4,"%d",&uStack_40b0);
      puVar2[lVar8] = (byte)uStack_40b0;
      pcVar4 = strchr(pcVar4,0x2c);
      if (pcVar4 == (char *)0x0) {
        return 0;
      }
      pcVar4 = pcVar4 + 1;
    }
  }
  return 0;
}

Assistant:

int GetHeadDataAndAuxDataSeanetEx(SEANET* pSeanet,
	unsigned char* scanline, double* pAngle,
	unsigned char* strippedauxdatabuf, int* pNbstrippedauxdatabytes)
{
	if (!bSeanetFromFile) return GetHeadDataAndAuxDataSeanet(pSeanet, scanline, pAngle, strippedauxdatabuf, pNbstrippedauxdatabytes);
	else return GetHeadDataSeanetEx(pSeanet, scanline, pAngle);
}